

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.cc
# Opt level: O2

void addStandardTypes(Registry *r)

{
  int iVar1;
  Registry *pRVar2;
  string *this;
  Numeric *pNVar3;
  int *extraout_RDX;
  int *arg;
  int *extraout_RDX_00;
  int *arg_00;
  int *arg_01;
  int *arg_02;
  int *arg_03;
  int *arg_04;
  int *arg_05;
  int *arg_06;
  int *arg_07;
  int *arg_08;
  int *arg_09;
  long lVar4;
  undefined4 local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string normalized_type_name;
  allocator local_39;
  Registry *local_38;
  
  this = (string *)operator_new(0x40);
  std::__cxx11::string::string((string *)&normalized_type_name,"/nil",(allocator *)&local_c0);
  Typelib::NullType::NullType((NullType *)this,&normalized_type_name);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_80);
  Typelib::Registry::add((Type *)r,this);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&normalized_type_name);
  std::__cxx11::string::string((string *)&normalized_type_name,"/nil",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/void",(allocator *)&local_c4);
  std::__cxx11::string::string((string *)&local_c0,"",&local_39);
  local_38 = r;
  Typelib::Registry::alias((string *)r,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&normalized_type_name);
  arg = extraout_RDX;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
    iVar1 = *(int *)((long)addStandardTypes::sizes + lVar4);
    local_80._M_dataplus._M_p._0_4_ = iVar1 * 8;
    boost::lexical_cast<std::__cxx11::string,int>(&local_c0,(boost *)&local_80,arg);
    std::operator+(&local_a0,"int",&local_c0);
    std::operator+(&normalized_type_name,&local_a0,"_t");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    pNVar3 = (Numeric *)operator_new(0x48);
    std::operator+(&local_a0,"/",&normalized_type_name);
    Typelib::Numeric::Numeric(pNVar3,(string *)&local_a0,(long)iVar1,SInt);
    std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_80);
    Typelib::Registry::add((Type *)local_38,(string *)pNVar3);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    pNVar3 = (Numeric *)operator_new(0x48);
    std::operator+(&local_a0,"/u",&normalized_type_name);
    Typelib::Numeric::Numeric(pNVar3,(string *)&local_a0,(long)iVar1,UInt);
    std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_80);
    Typelib::Registry::add((Type *)local_38,(string *)pNVar3);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&normalized_type_name);
    arg = extraout_RDX_00;
  }
  local_80._M_dataplus._M_p._0_4_ = 8;
  boost::lexical_cast<std::__cxx11::string,int>(&local_c0,(boost *)&local_80,arg);
  std::operator+(&local_a0,"/int",&local_c0);
  std::operator+(&normalized_type_name,&local_a0,"_t");
  pRVar2 = local_38;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_a0,"/signed char",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/char",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 8;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_00);
  std::operator+(&local_c0,"/uint",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned char",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x20;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_01);
  std::operator+(&local_c0,"/int",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/wchar_t",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x10;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_02);
  std::operator+(&local_c0,"/int",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/signed short int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed int short",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int signed short",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/short signed int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed short int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed short",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/short signed",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/short",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/short int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x10;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_03);
  std::operator+(&local_c0,"/uint",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/short unsigned int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/short int unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int short unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned short int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/short unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned short",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x20;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_04);
  std::operator+(&local_c0,"/int",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/signed int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int signed",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x20;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_05);
  std::operator+(&local_c0,"/uint",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_06);
  std::operator+(&local_c0,"/int",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/signed long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed int long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int signed long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long signed int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long signed",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_07);
  std::operator+(&local_c0,"/uint",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/long unsigned int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long int unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int long unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_08);
  std::operator+(&local_c0,"/int",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/signed long long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed long int long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed int long long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int signed long long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long signed long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long signed int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long int signed",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/signed long long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long signed",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long signed long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long int",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long int long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int long long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_c4 = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(&local_80,(boost *)&local_c4,arg_09);
  std::operator+(&local_c0,"/uint",&local_80);
  std::operator+(&local_a0,&local_c0,"_t");
  std::__cxx11::string::operator=((string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned long long int",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned long int long",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned int long long",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/int unsigned long long",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long unsigned long int",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long unsigned int",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long int unsigned",(allocator *)&local_80)
  ;
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/unsigned long long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long long unsigned",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"/long unsigned long",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::alias((string *)pRVar2,(string *)&normalized_type_name,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  pNVar3 = (Numeric *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_a0,"/float",(allocator *)&local_80);
  Typelib::Numeric::Numeric(pNVar3,(string *)&local_a0,4,Float);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::add((Type *)pRVar2,(string *)pNVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  pNVar3 = (Numeric *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_a0,"/double",(allocator *)&local_80);
  Typelib::Numeric::Numeric(pNVar3,(string *)&local_a0,8,Float);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::add((Type *)pRVar2,(string *)pNVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  pNVar3 = (Numeric *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_a0,"/bool",(allocator *)&local_80);
  Typelib::Numeric::Numeric(pNVar3,(string *)&local_a0,1,UInt);
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_c4);
  Typelib::Registry::add((Type *)pRVar2,(string *)pNVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&normalized_type_name);
  return;
}

Assistant:

static void addStandardTypes(Typelib::Registry& r)
{
    BOOST_STATIC_ASSERT((Typelib::NamespaceMark == '/'));

    r.add(new NullType("/nil"));
    r.alias("/nil", "/void");

    // Add standard sized integers
    static const int sizes[] = { 1, 2, 4, 8 };
    for (size_t i = 0; i < sizeof(sizes)/sizeof(sizes[0]); ++i)
    {
        std::string suffix = "int" + boost::lexical_cast<std::string>(sizes[i] * 8) + "_t";
        r.add(new Numeric("/"  + suffix, sizes[i], Numeric::SInt));
        r.add(new Numeric("/u" + suffix, sizes[i], Numeric::UInt));
    }

    std::string normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<signed char>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed char");
    if (std::numeric_limits<char>::is_signed)
        r.alias(normalized_type_name, "/char");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<signed char>::digits + 1) + "_t";
    if (!std::numeric_limits<char>::is_signed)
        r.alias(normalized_type_name, "/char");
    r.alias(normalized_type_name, "/unsigned char");

    if(std::numeric_limits<wchar_t>::is_signed)
    {
        normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<wchar_t>::digits + 1) + "_t";
    } else {
        normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<wchar_t>::digits) + "_t";
    }
    r.alias(normalized_type_name, "/wchar_t");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<short int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed short int");
    r.alias(normalized_type_name, "/signed int short");
    r.alias(normalized_type_name, "/int signed short");
    r.alias(normalized_type_name, "/short signed int");
    r.alias(normalized_type_name, "/signed short int");
    r.alias(normalized_type_name, "/signed short");
    r.alias(normalized_type_name, "/short signed");
    r.alias(normalized_type_name, "/short");
    r.alias(normalized_type_name, "/short int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<short int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/short unsigned int");
    r.alias(normalized_type_name, "/short int unsigned");
    r.alias(normalized_type_name, "/int short unsigned");
    r.alias(normalized_type_name, "/unsigned short int");
    r.alias(normalized_type_name, "/short unsigned");
    r.alias(normalized_type_name, "/unsigned short");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed int");
    r.alias(normalized_type_name, "/signed");
    r.alias(normalized_type_name, "/int signed");
    r.alias(normalized_type_name, "/int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/unsigned int");
    r.alias(normalized_type_name, "/unsigned");
    r.alias(normalized_type_name, "/int unsigned");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed long int");
    r.alias(normalized_type_name, "/signed int long");
    r.alias(normalized_type_name, "/int signed long");
    r.alias(normalized_type_name, "/long signed int");
    r.alias(normalized_type_name, "/signed long int");
    r.alias(normalized_type_name, "/signed long");
    r.alias(normalized_type_name, "/long signed");
    r.alias(normalized_type_name, "/long");
    r.alias(normalized_type_name, "/long int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/long unsigned int");
    r.alias(normalized_type_name, "/long int unsigned");
    r.alias(normalized_type_name, "/int long unsigned");
    r.alias(normalized_type_name, "/unsigned long int");
    r.alias(normalized_type_name, "/long unsigned");
    r.alias(normalized_type_name, "/unsigned long");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<long long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed long long int");
    r.alias(normalized_type_name, "/signed long int long");
    r.alias(normalized_type_name, "/signed int long long");
    r.alias(normalized_type_name, "/int signed long long");
    r.alias(normalized_type_name, "/long signed long int");
    r.alias(normalized_type_name, "/long long signed int");
    r.alias(normalized_type_name, "/long long int signed");
    r.alias(normalized_type_name, "/signed long long");
    r.alias(normalized_type_name, "/long long signed");
    r.alias(normalized_type_name, "/long signed long");
    r.alias(normalized_type_name, "/long long int");
    r.alias(normalized_type_name, "/long int long");
    r.alias(normalized_type_name, "/int long long");
    r.alias(normalized_type_name, "/long long");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<long long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/unsigned long long int");
    r.alias(normalized_type_name, "/unsigned long int long");
    r.alias(normalized_type_name, "/unsigned int long long");
    r.alias(normalized_type_name, "/int unsigned long long");
    r.alias(normalized_type_name, "/long unsigned long int");
    r.alias(normalized_type_name, "/long long unsigned int");
    r.alias(normalized_type_name, "/long long int unsigned");
    r.alias(normalized_type_name, "/unsigned long long");
    r.alias(normalized_type_name, "/long long unsigned");
    r.alias(normalized_type_name, "/long unsigned long");

    BOOST_STATIC_ASSERT(( sizeof(float) == sizeof(int32_t) ));
    BOOST_STATIC_ASSERT(( sizeof(double) == sizeof(int64_t) ));
    r.add(new Numeric("/float",  4, Numeric::Float));
    r.add(new Numeric("/double", 8, Numeric::Float));

    // Finally, add definition for boolean types
    r.add(new Numeric("/bool", sizeof(bool), Numeric::UInt));
}